

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::checkForCustomUnit(string *unit_string)

{
  char *pcVar1;
  precise_unit pVar2;
  precise_unit pVar3;
  precise_unit pVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  size_t sVar8;
  size_type sVar9;
  precise_unit pVar10;
  precise_unit pVar11;
  long lStack_80;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  string local_40;
  
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  pVar4.base_units_ = (unit_data)0xfa94a488;
  pVar4.commodity_ = 0;
  pVar4.multiplier_ = NAN;
  pVar3.base_units_ = (unit_data)0xfa94a488;
  pVar3.commodity_ = 0;
  pVar3.multiplier_ = NAN;
  pVar11.base_units_ = (unit_data)0xfa94a488;
  pVar11.commodity_ = 0;
  pVar11.multiplier_ = NAN;
  pVar2.base_units_ = (unit_data)0xfa94a488;
  pVar2.commodity_ = 0;
  pVar2.multiplier_ = NAN;
  pVar10.base_units_ = (unit_data)0xfa94a488;
  pVar10.commodity_ = 0;
  pVar10.multiplier_ = NAN;
  if (*pcVar1 == '{') {
    if (pcVar1[unit_string->_M_string_length - 1] != '}') {
      return pVar4;
    }
    std::__cxx11::string::string((string *)&csub,"\'u}",&local_69);
    bVar5 = ends_with(unit_string,&csub);
    std::__cxx11::string::~string((string *)&csub);
    if (!bVar5) {
      std::__cxx11::string::string((string *)&csub,"index}",&local_69);
      bVar5 = ends_with(unit_string,&csub);
      goto LAB_0015b2a1;
    }
    lStack_80 = -3;
  }
  else {
    if (*pcVar1 != '[') {
      return pVar10;
    }
    if (pcVar1[unit_string->_M_string_length - 1] != ']') {
      return pVar2;
    }
    std::__cxx11::string::string((string *)&csub,"U]",&local_69);
    bVar5 = ends_with(unit_string,&csub);
    std::__cxx11::string::~string((string *)&csub);
    if (!bVar5) {
      std::__cxx11::string::string((string *)&csub,"index]",&local_69);
      bVar5 = ends_with(unit_string,&csub);
LAB_0015b2a1:
      std::__cxx11::string::~string((string *)&csub);
      if (bVar5 == false) {
        return pVar3;
      }
      bVar5 = true;
      lStack_80 = -6;
      goto LAB_0015b2bc;
    }
    lStack_80 = -2;
  }
  bVar5 = false;
LAB_0015b2bc:
  if (lStack_80 + unit_string->_M_string_length != -1) {
    std::__cxx11::string::substr((ulong)&csub,(ulong)unit_string);
    if (bVar5) {
      std::__cxx11::string::string((string *)&local_40,(string *)&csub);
      uVar6 = getCommodity(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pVar10 = precise::generate_custom_count_unit(0);
      pVar11.commodity_ = uVar6 | pVar10.commodity_;
      pVar11.base_units_ = pVar10.base_units_;
      pVar11.multiplier_ = pVar10.multiplier_;
    }
    else {
      for (sVar9 = 0; csub._M_string_length != sVar9; sVar9 = sVar9 + 1) {
        iVar7 = tolower((int)csub._M_dataplus._M_p[sVar9]);
        csub._M_dataplus._M_p[sVar9] = (char)iVar7;
      }
      sVar8 = std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_69,&csub);
      pVar11 = precise::generate_custom_unit((ushort)sVar8 & 0x3f);
    }
    std::__cxx11::string::~string((string *)&csub);
  }
  return pVar11;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}